

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O1

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> __thiscall
flatbuffers::NewLuaBfbsGenerator(flatbuffers *this,string *flatc_version)

{
  pointer pcVar1;
  undefined8 *puVar2;
  long *plVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_492;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_491;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  Config local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined4 *local_2d0;
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined2 local_2bc;
  undefined2 *local_2b0;
  undefined8 local_2a8;
  undefined2 local_2a0;
  undefined1 local_29e;
  undefined4 *local_290;
  undefined8 local_288;
  undefined4 local_280;
  undefined1 local_27c;
  undefined4 *local_270;
  undefined8 local_268;
  undefined4 local_260;
  undefined2 local_25c;
  undefined1 local_25a;
  undefined2 *local_250;
  undefined8 local_248;
  undefined2 local_240;
  undefined2 local_23e;
  undefined4 *local_230;
  undefined8 local_228;
  undefined4 local_220;
  undefined2 local_21c;
  undefined4 *local_210;
  undefined8 local_208;
  undefined4 local_200 [4];
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8;
  undefined4 *local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined2 *local_1b0;
  undefined8 local_1a8;
  undefined2 local_1a0;
  undefined1 local_19e;
  undefined2 *local_190;
  undefined8 local_188;
  undefined2 local_180;
  undefined1 local_17e;
  undefined4 *local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined2 *local_150;
  undefined8 local_148;
  undefined2 local_140;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined2 *local_130;
  undefined8 local_128;
  undefined2 local_120;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined2 *local_110;
  undefined8 local_108;
  undefined2 local_100;
  undefined1 local_fe;
  undefined4 *local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined2 local_dc;
  undefined1 local_da;
  undefined4 *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined2 local_bc;
  undefined1 local_ba;
  undefined4 *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined1 local_9c;
  undefined4 *local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined4 *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  long *local_50 [2];
  undefined8 local_40;
  
  puVar2 = (undefined8 *)operator_new(0x270);
  local_478 = puVar2 + 3;
  puVar2[1] = local_478;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 0;
  puVar2[5] = 0;
  *puVar2 = &PTR__LuaBfbsGenerator_003f48b8;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[6] = puVar2 + 0xc;
  puVar2[7] = 1;
  puVar2[8] = 0;
  puVar2[9] = 0;
  *(undefined4 *)(puVar2 + 10) = 0x3f800000;
  puVar2[0xf] = 0;
  puVar2[0x10] = 0;
  puVar2[0x11] = 0;
  puVar2[0x12] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0x10] = puVar2 + 0xe;
  puVar2[0x11] = puVar2 + 0xe;
  puVar2[0x12] = 0;
  local_480 = puVar2 + 0x15;
  puVar2[0x13] = local_480;
  puVar2[0x14] = 0;
  *(undefined1 *)(puVar2 + 0x15) = 0;
  local_488 = puVar2 + 0x1b;
  puVar2[0x17] = 0;
  puVar2[0x18] = 0;
  puVar2[0x19] = local_488;
  pcVar1 = (flatc_version->_M_dataplus)._M_p;
  local_490 = puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 0x19),pcVar1,pcVar1 + flatc_version->_M_string_length);
  local_440.enum_variant_seperator._M_dataplus._M_p =
       (pointer)&local_440.enum_variant_seperator.field_2;
  local_440.types = kUpperCamel;
  local_440.constants = kUnknown;
  local_440.methods = kUpperCamel;
  local_440.functions = kUpperCamel;
  local_440.fields = kUpperCamel;
  local_440.variables = kLowerCamel;
  local_440.variants = kKeep;
  local_440.enum_variant_seperator._M_string_length = 0;
  local_440.enum_variant_seperator.field_2._M_local_buf[0] = '\0';
  local_440.escape_keywords = AfterConvertingCase;
  local_440.namespaces = kKeep;
  local_440.namespace_seperator._M_dataplus._M_p = (pointer)&local_440.namespace_seperator.field_2;
  local_440.namespace_seperator.field_2._M_allocated_capacity._0_2_ = 0x5f5f;
  local_440.namespace_seperator._M_string_length = 2;
  local_440.namespace_seperator.field_2._M_local_buf[2] = '\0';
  local_440.object_prefix._M_dataplus._M_p = (pointer)&local_440.object_prefix.field_2;
  local_440.object_prefix._M_string_length = 0;
  local_440.object_prefix.field_2._M_local_buf[0] = '\0';
  local_440.object_suffix._M_dataplus._M_p = (pointer)&local_440.object_suffix.field_2;
  local_440.object_suffix._M_string_length = 0;
  local_440.object_suffix.field_2._M_local_buf[0] = '\0';
  local_440.keyword_prefix._M_dataplus._M_p = (pointer)&local_440.keyword_prefix.field_2;
  local_440.keyword_prefix._M_string_length = 0;
  local_440.keyword_prefix.field_2._M_local_buf[0] = '\0';
  local_440.keyword_suffix._M_dataplus._M_p = (pointer)&local_440.keyword_suffix.field_2;
  local_440.keyword_suffix.field_2._M_local_buf[0] = '_';
  local_440.keyword_suffix._M_string_length = 1;
  local_440.keyword_suffix.field_2._M_local_buf[1] = '\0';
  local_440.filenames = kKeep;
  local_440.directories = kKeep;
  local_440.output_path._M_dataplus._M_p = (pointer)&local_440.output_path.field_2;
  local_440.output_path._M_string_length = 0;
  local_440.output_path.field_2._M_local_buf[0] = '\0';
  local_440.filename_suffix._M_dataplus._M_p = (pointer)&local_440.filename_suffix.field_2;
  local_440.filename_suffix._M_string_length = 0;
  local_440.filename_suffix.field_2._M_local_buf[0] = '\0';
  local_440.filename_extension._M_dataplus._M_p = (pointer)&local_440.filename_extension.field_2;
  local_440.filename_extension.field_2._M_allocated_capacity._0_4_ = 0x61756c2e;
  local_440.filename_extension._M_string_length = 4;
  local_440.filename_extension.field_2._M_local_buf[4] = '\0';
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0.field_2._M_allocated_capacity._0_4_ = 0x646e61;
  local_2f0._M_string_length = 3;
  local_2d0 = &local_2c0;
  local_2c0 = 0x61657262;
  local_2bc = 0x6b;
  local_2c8 = 5;
  local_2b0 = &local_2a0;
  local_2a0 = 0x6f64;
  local_2a8 = 2;
  local_29e = 0;
  local_290 = &local_280;
  local_280 = 0x65736c65;
  local_288 = 4;
  local_27c = 0;
  local_270 = &local_260;
  local_260 = 0x65736c65;
  local_25c = 0x6669;
  local_268 = 6;
  local_25a = 0;
  local_250 = &local_240;
  local_240 = 0x6e65;
  local_23e = 100;
  local_248 = 3;
  local_230 = &local_220;
  local_220 = 0x736c6166;
  local_21c = 0x65;
  local_228 = 5;
  local_210 = local_200;
  local_200[0] = 0x726f66;
  local_208 = 3;
  local_1f0 = &local_1e0;
  local_1e0 = 0x6e6f6974636e7566;
  local_1e8 = 8;
  local_1d8 = 0;
  local_1d0 = &local_1c0;
  local_1c0 = 0x6f746f67;
  local_1c8 = 4;
  local_1bc = 0;
  local_1b0 = &local_1a0;
  local_1a0 = 0x6669;
  local_1a8 = 2;
  local_19e = 0;
  local_190 = &local_180;
  local_180 = 0x6e69;
  local_188 = 2;
  local_17e = 0;
  local_170 = &local_160;
  local_15c = 0x6c;
  local_160 = 0x61636f6c;
  local_168 = 5;
  local_15b = 0;
  local_150 = &local_140;
  local_13e = 0x6c;
  local_140 = 0x696e;
  local_148 = 3;
  local_13d = 0;
  local_130 = &local_120;
  local_11e = 0x74;
  local_120 = 0x6f6e;
  local_128 = 3;
  local_11d = 0;
  local_110 = &local_100;
  local_100 = 0x726f;
  local_108 = 2;
  local_fe = 0;
  local_f0 = &local_e0;
  local_dc = 0x7461;
  local_e0 = 0x65706572;
  local_e8 = 6;
  local_da = 0;
  local_d0 = &local_c0;
  local_bc = 0x6e72;
  local_c0 = 0x75746572;
  local_c8 = 6;
  local_ba = 0;
  local_b0 = &local_a0;
  local_a0 = 0x6e656874;
  local_a8 = 4;
  local_9c = 0;
  local_90 = &local_80;
  local_80 = 0x65757274;
  local_88 = 4;
  local_7c = 0;
  local_70 = &local_60;
  uStack_5c = 0x6c;
  local_60 = 0x69746e75;
  local_68 = 5;
  uStack_5b = 0;
  plVar3 = &local_40;
  local_40._4_1_ = 0x65;
  local_40._0_4_ = 0x6c696877;
  local_50[1] = (long *)0x5;
  local_40._5_1_ = 0;
  __l._M_len = 0x16;
  __l._M_array = &local_2f0;
  local_50[0] = plVar3;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_470,__l,&local_491,&local_492);
  lVar4 = -0x2c0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  BfbsNamer::BfbsNamer
            ((BfbsNamer *)(puVar2 + 0x1d),&local_440,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_470);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_470);
  Namer::Config::~Config(&local_440);
  *(undefined8 **)this = local_490;
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CodeGenerator> NewLuaBfbsGenerator(
    const std::string &flatc_version) {
  return std::unique_ptr<LuaBfbsGenerator>(new LuaBfbsGenerator(flatc_version));
}